

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O1

int main(void)

{
  r[0].type = 'i';
  l[0].type = 'i';
  l[0].val.f = 0x3039;
  r[0].val.i = 0x2a;
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"12345","42",0x4d);
  special();
  floats();
  doubles();
  r[0].type = 'h';
  l[0].type = 'h';
  l[0].val.d = 2.47032822920623e-314;
  r[0].val.s = (char *)0xfffffffed5fa0e00;
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"5000000000","-5000000000",0x92);
  timestamps();
  midi();
  blobs();
  arrays();
  ranges();
  l[0].type = 'i';
  l[0].val.t = l[0].val.t & 0xffffffff00000000;
  r[0].type = 'h';
  r[0].val.d = 4.94065645841247e-324;
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"int type","huge int type",0x16d);
  multiple_args();
  l[1].type = 'i';
  l[0].type = 'i';
  l[1].val.i = 0x2a;
  l[0].val.i = 0x2a;
  cmp_gt(l,l,2,1,(rtosc_cmp_options *)0x0,"size-2-array","size-1-array",0x18b);
  printf("# %d test(s) failed out of %d (currently passing %f%% tests)\n",
         100.0 - ((double)global_err * 100.0) / (double)test_counter);
  return (uint)(global_err != 0);
}

Assistant:

int main()
{
    ints();
    special();
    floats();
    doubles();
    huge_ints();
    timestamps();
    midi();
    blobs();
    arrays();
    ranges();
    different_types();
    multiple_args();
    different_sizes();

    return test_summary();
}